

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::detachClausePurgatory(Solver *this,CRef cr,bool strict)

{
  vec<Glucose::Solver::Watcher> *pvVar1;
  uint *puVar2;
  vec<Glucose::Solver::Watcher> *pvVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  int iVar8;
  Lit local_4;
  
  puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  if ((int)CONCAT71(in_register_00000011,strict) == 0) {
    uVar6 = (long)(int)puVar2[(ulong)cr + 3] ^ 1;
    pcVar4 = (this->unaryWatches).dirty.data;
    if (pcVar4[uVar6] == '\0') {
      pcVar4[uVar6] = '\x01';
      vec<Glucose::Lit>::push(&(this->unaryWatches).dirties,&local_4);
    }
  }
  else {
    uVar6 = (long)(int)puVar2[(ulong)cr + 3] ^ 1;
    pvVar3 = (this->unaryWatches).occs.data;
    pvVar1 = pvVar3 + uVar6;
    uVar5 = pvVar3[uVar6].sz;
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    else {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        if (pvVar1->data[uVar7].cref == cr) break;
        uVar7 = uVar7 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar5 != uVar7);
    }
    iVar8 = uVar5 - 1;
    if ((int)uVar6 < iVar8) {
      uVar7 = uVar6 & 0xffffffff;
      do {
        pvVar1->data[uVar7] = pvVar1->data[uVar7 + 1];
        iVar8 = pvVar1->sz + -1;
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        uVar7 = uVar7 + 1;
      } while ((int)uVar5 < iVar8);
    }
    pvVar1->sz = iVar8;
  }
  return;
}

Assistant:

void Solver::detachClausePurgatory(CRef cr, bool strict) {
    const Clause &c = ca[cr];

    assert(c.size() > 1);
    if(strict)
        remove(unaryWatches[~c[0]], Watcher(cr, c[1]));
    else
        unaryWatches.smudge(~c[0]);
}